

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
kratos::InterfaceInstantiationVisitor::visit
          (InterfaceInstantiationVisitor *this,Generator *generator)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Generator *this_00;
  _Base_ptr p_Var2;
  __node_base *p_Var3;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  shared_ptr<kratos::InterfaceInstantiationStmt> stmt;
  Generator *local_38;
  Generator *generator_local;
  
  local_38 = generator;
  for (p_Var2 = (generator->interfaces_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(generator->interfaces_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(p_Var2 + 2);
    if ((*(char *)&p_Var1[0xb]._vptr__Sp_counted_base == '\0') &&
       (*(char *)&p_Var1[8]._vptr__Sp_counted_base == '\0')) {
      stmt.super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var1;
      std::make_shared<kratos::InterfaceInstantiationStmt,kratos::Generator*&,kratos::InterfaceRef*>
                ((Generator **)local_50,(InterfaceRef **)&local_38);
      this_00 = local_38;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::InterfaceInstantiationStmt,void>
                (local_60,(__shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>
                           *)local_50);
      Generator::add_stmt(this_00,(shared_ptr<kratos::Stmt> *)local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      p_Var3 = &(((InstantiationStmt *)((long)local_50 + 0xc0))->connection_stmt_)._M_h.
                _M_before_begin;
      while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
        (*(code *)(p_Var3[1]._M_nxt)->_M_nxt[9]._M_nxt)();
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    }
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        const auto& interfaces = generator->interfaces();
        for (auto const& [name, interface] : interfaces) {
            if (interface->has_instantiated()) continue;
            if (interface->is_port()) continue;
            auto stmt = std::make_shared<InterfaceInstantiationStmt>(generator, interface.get());
            generator->add_stmt(stmt);

            // remove the stmts that's fold into the instantiation statement
            for (auto const& st : stmt->connection_stmt()) {
                st->remove_from_parent();
            }
        }
    }